

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<double> * __thiscall Imath_3_2::Matrix33<double>::transpose(Matrix33<double> *this)

{
  Matrix33<double> tmp;
  Matrix33<double> local_50;
  
  local_50.x[0][1] = this->x[1][0];
  local_50.x[0][2] = this->x[2][0];
  local_50.x[0][0] = this->x[0][0];
  local_50.x[1][0] = this->x[0][1];
  local_50.x[1][1] = this->x[1][1];
  local_50.x[1][2] = this->x[2][1];
  local_50.x[2][0] = this->x[0][2];
  local_50.x[2][1] = this->x[1][2];
  local_50.x[2][2] = this->x[2][2];
  operator=(this,&local_50);
  return this;
}

Assistant:

const Matrix33<T>&
                 Matrix33<T>::transpose () IMATH_NOEXCEPT
{
    Matrix33 tmp (
        x[0][0],
        x[1][0],
        x[2][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[0][2],
        x[1][2],
        x[2][2]);
    *this = tmp;
    return *this;
}